

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

bool __thiscall QHttpNetworkConnectionChannel::ensureConnection(QHttpNetworkConnectionChannel *this)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char cVar4;
  byte bVar5;
  quint16 port;
  SocketState SVar6;
  ProxyType PVar7;
  ConnectionType CVar8;
  QHttpNetworkReply *obj;
  QAbstractSocket *pQVar9;
  qsizetype qVar10;
  long lVar11;
  QLocalSocket *this_00;
  EVP_PKEY_CTX *in_RSI;
  undefined8 uVar12;
  QHttpNetworkConnectionPrivate *this_01;
  QHttpNetworkRequest *this_02;
  long in_FS_OFFSET;
  shared_ptr<QSslContext> sVar13;
  QByteArrayView name;
  QByteArrayView name_00;
  QAnyStringView newValue;
  QNetworkProxyPrivate *local_c8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_c0;
  undefined1 local_b8 [16];
  QHttpHeaders h;
  QNetworkProxy proxy;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_88;
  size_t sStack_80;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  if (this[0x19] == (QHttpNetworkConnectionChannel)0x0) {
    init(this,in_RSI);
  }
  SVar6 = QSocketAbstraction::socketState(*(QIODevice **)(this + 0x10));
  if (SVar6 == UnconnectedState) {
LAB_001f04c0:
    *(undefined4 *)(this + 0x20) = 1;
    this[0x58] = this[0x18];
    *(undefined4 *)(this + 0xb0) = 0;
    *(undefined2 *)(this + 0x70) = 0;
    QAuthenticator::detach((QAuthenticator *)(this + 0x60));
    *(undefined1 *)(*(long *)(this + 0x60) + 0x90) = 0;
    QAuthenticator::detach((QAuthenticator *)(this + 0x68));
    lVar11 = *(long *)(this + 0x68);
    *(undefined1 *)(lVar11 + 0x90) = 0;
    lVar1 = *(long *)(this + 0x60);
    if ((lVar1 != 0) && (*(int *)(lVar1 + 0x94) == 3)) {
      *(undefined4 *)(lVar1 + 0x94) = 0;
    }
    if (*(int *)(lVar11 + 0x94) == 3) {
      *(undefined4 *)(lVar11 + 0x94) = 0;
    }
    this_01 = *(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8);
    local_58.d = (this_01->hostName).d.d;
    local_58.ptr = (this_01->hostName).d.ptr;
    local_58.size = (this_01->hostName).d.size;
    if ((QNetworkProxyPrivate *)local_58.d != (QNetworkProxyPrivate *)0x0) {
      LOCK();
      (((QArrayData *)&((QNetworkProxyPrivate *)local_58.d)->super_QSharedData)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QNetworkProxyPrivate *)local_58.d)->super_QSharedData)->ref_)._q_value
           .super___atomic_base<int>._M_i + 1;
      UNLOCK();
      this_01 = *(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8);
    }
    port = this_01->port;
    obj = QHttpNetworkConnectionPrivate::predictNextRequestsReply(this_01);
    if (obj == (QHttpNetworkReply *)0x0) {
      lVar11 = *(long *)(this + 0x80);
      if ((lVar11 != 0) && (*(long *)(lVar11 + 0x30) != 0)) {
        obj = *(QHttpNetworkReply **)(*(long *)(lVar11 + 0x20) + 0x38);
        goto LAB_001f05d2;
      }
    }
    else {
LAB_001f05d2:
      QMetaObject::invokeMethod<>(&obj->super_QObject,"socketStartedConnecting",QueuedConnection);
    }
    PVar7 = QNetworkProxy::type((QNetworkProxy *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xc0));
    if ((PVar7 != NoProxy) && (this[0x18] == (QHttpNetworkConnectionChannel)0x0)) {
      QNetworkProxy::hostName
                ((QString *)&local_78,
                 (QNetworkProxy *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xc0));
      qVar10 = local_58.size;
      pcVar3 = local_58.ptr;
      pDVar2 = local_58.d;
      local_58.d = local_78.d;
      local_58.ptr = local_78.ptr;
      local_78.d = pDVar2;
      local_78.ptr = pcVar3;
      local_58.size = local_78.size;
      local_78.size = qVar10;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      port = QNetworkProxy::port((QNetworkProxy *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xc0));
    }
    pQVar9 = QtPrivate::qobject_cast_helper<QAbstractSocket*,QObject>(*(QObject **)(this + 0x10));
    if (pQVar9 != (QAbstractSocket *)0x0) {
      QAbstractSocket::proxy((QAbstractSocket *)&local_78);
      PVar7 = QNetworkProxy::type((QNetworkProxy *)&local_78);
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_78);
      if (PVar7 == HttpProxy) {
        local_78.d = (Data *)0x0;
        local_78.ptr = (char16_t *)0x0;
        local_78.size = 0;
        this_02 = (QHttpNetworkRequest *)(this + 0x28);
        QHttpNetworkRequest::url((QHttpNetworkRequest *)&proxy);
        cVar4 = QUrl::isEmpty();
        QUrl::~QUrl((QUrl *)&proxy);
        if (cVar4 == '\0') {
          qVar10 = QByteArrayView::lengthHelperCharArray("user-agent",0xb);
LAB_001f07a4:
          h.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)
                      (totally_ordered_wrapper<QHttpHeadersPrivate_*>)0x0;
          name.m_data = "user-agent";
          name.m_size = qVar10;
          QHttpNetworkRequest::headerField((QByteArray *)&proxy,this_02,name,(QByteArray *)&h);
          local_78.d = (Data *)proxy.d.d.ptr;
          proxy.d.d.ptr =
               (QSharedDataPointer<QNetworkProxyPrivate>)
               (totally_ordered_wrapper<QNetworkProxyPrivate_*>)0x0;
          local_78.ptr = local_88.m_data_utf16;
          local_78.size = sStack_80;
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&proxy);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&h);
        }
        else {
          CVar8 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0xf8));
          if (CVar8 == ConnectionTypeHTTP2Direct) {
            lVar11 = *(long *)(this + 0x80);
LAB_001f0734:
            this_02 = (QHttpNetworkRequest *)(*(long *)(lVar11 + 0x20) + 0x28);
            qVar10 = QByteArrayView::lengthHelperCharArray("user-agent",0xb);
            goto LAB_001f07a4;
          }
          CVar8 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0xf8));
          if (((CVar8 == ConnectionTypeHTTP2) && (lVar11 = *(long *)(this + 0x80), lVar11 != 0)) &&
             (*(long *)(lVar11 + 0x30) != 0)) goto LAB_001f0734;
          QHttpNetworkConnectionPrivate::predictNextRequest
                    ((QHttpNetworkConnectionPrivate *)local_b8);
          qVar10 = QByteArrayView::lengthHelperCharArray("user-agent",0xb);
          h.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)
                      (totally_ordered_wrapper<QHttpHeadersPrivate_*>)0x0;
          name_00.m_data = "user-agent";
          name_00.m_size = qVar10;
          QHttpNetworkRequest::headerField
                    ((QByteArray *)&proxy,(QHttpNetworkRequest *)local_b8,name_00,(QByteArray *)&h);
          local_78.d = (Data *)proxy.d.d.ptr;
          proxy.d.d.ptr =
               (QSharedDataPointer<QNetworkProxyPrivate>)
               (totally_ordered_wrapper<QNetworkProxyPrivate_*>)0x0;
          local_78.ptr = local_88.m_data_utf16;
          local_78.size = sStack_80;
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&proxy);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&h);
          QHttpNetworkRequest::~QHttpNetworkRequest((QHttpNetworkRequest *)local_b8);
        }
        if (sStack_80 != 0) {
          proxy.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QAbstractSocket::proxy((QAbstractSocket *)&proxy);
          h.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QNetworkProxy::headers((QNetworkProxy *)&h);
          newValue.m_size = sStack_80;
          newValue.field_0.m_data = local_88.m_data;
          QHttpHeaders::replaceOrAppend(&h,UserAgent,newValue);
          QNetworkProxy::setHeaders(&proxy,&h);
          QAbstractSocket::setProxy(pQVar9,&proxy);
          QHttpHeaders::~QHttpHeaders(&h);
          QNetworkProxy::~QNetworkProxy(&proxy);
        }
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
      }
    }
    if (this[0x18] == (QHttpNetworkConnectionChannel)0x1) {
      pQVar9 = (QAbstractSocket *)
               QtPrivate::qobject_cast_helper<QSslSocket*,QObject>(*(QObject **)(this + 0x10));
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      sVar13 = QHttpNetworkConnection::sslContext((QHttpNetworkConnection *)&local_78);
      if ((QNetworkProxyPrivate *)local_78.d != (QNetworkProxyPrivate *)0x0) {
        local_c8 = (QNetworkProxyPrivate *)local_78.d;
        local_c0.m_data = local_78.ptr;
        local_78.d = (Data *)0x0;
        local_78.ptr = (char16_t *)0x0;
        sVar13.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_c8;
        QSslSocketPrivate::checkSettingSslContext((QSslSocket *)pQVar9,sVar13);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.ptr);
      QSslSocket::setPeerVerifyName
                ((QSslSocket *)pQVar9,(QString *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0x118));
      QSslSocket::connectToHostEncrypted
                ((QSslSocket *)pQVar9,(QString *)&local_58,port,(OpenMode)0x3,
                 *(NetworkLayerProtocol *)(this + 0xe8));
      if (this[0x89] == (QHttpNetworkConnectionChannel)0x1) {
        QSslSocket::ignoreSslErrors((QSslSocket *)pQVar9);
      }
      QSslSocket::ignoreSslErrors((QSslSocket *)pQVar9,(QList<QSslError> *)(this + 0x90));
LAB_001f0b55:
      lVar11 = *(long *)pQVar9;
      uVar12 = 0x10000;
LAB_001f0b5d:
      (**(code **)(lVar11 + 0x108))(pQVar9,uVar12);
    }
    else {
      PVar7 = QNetworkProxy::type((QNetworkProxy *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xc0));
      if (PVar7 != NoProxy) {
LAB_001f0b27:
        pQVar9 = QtPrivate::qobject_cast_helper<QAbstractSocket*,QObject>
                           (*(QObject **)(this + 0x10));
        (**(code **)(*(long *)pQVar9 + 0xf8))(pQVar9,&local_58,port,3,*(undefined4 *)(this + 0xe8));
        goto LAB_001f0b55;
      }
      QHttpNetworkConnection::cacheProxy((QHttpNetworkConnection *)&local_78);
      PVar7 = QNetworkProxy::type((QNetworkProxy *)&local_78);
      if (PVar7 != NoProxy) {
        QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_78);
        goto LAB_001f0b27;
      }
      QHttpNetworkConnection::transparentProxy((QHttpNetworkConnection *)&proxy);
      PVar7 = QNetworkProxy::type(&proxy);
      QNetworkProxy::~QNetworkProxy(&proxy);
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_78);
      if (PVar7 != NoProxy) goto LAB_001f0b27;
      pQVar9 = QtPrivate::qobject_cast_helper<QAbstractSocket*,QObject>(*(QObject **)(this + 0x10));
      if (pQVar9 != (QAbstractSocket *)0x0) {
        (**(code **)(*(long *)pQVar9 + 0xf8))
                  (pQVar9,&local_58,port,0x23,*(undefined4 *)(this + 0xe8));
        lVar11 = *(long *)pQVar9;
        uVar12 = 0x400;
        goto LAB_001f0b5d;
      }
      this_00 = QtPrivate::qobject_cast_helper<QLocalSocket*,QObject>(*(QObject **)(this + 0x10));
      if (this_00 != (QLocalSocket *)0x0) {
        QLocalSocket::connectToServer(this_00,(QString *)&local_58,(OpenMode)0x3);
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  else if ((SVar6 == ClosingState) || (cVar4 = QIODevice::isOpen(), cVar4 == '\0')) {
    if (*(long *)(this + 0x38) != 0) {
      this[0x50] = (QHttpNetworkConnectionChannel)0x1;
    }
  }
  else if (1 < SVar6 - HostLookupState) {
    if (SVar6 == ConnectedState) {
      bVar5 = (byte)this[0x58] ^ 1;
      goto LAB_001f0b75;
    }
    goto LAB_001f04c0;
  }
  bVar5 = 0;
LAB_001f0b75:
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)bVar5;
}

Assistant:

bool QHttpNetworkConnectionChannel::ensureConnection()
{
    if (!isInitialized)
        init();

    QAbstractSocket::SocketState socketState = QSocketAbstraction::socketState(socket);

    // resend this request after we receive the disconnected signal
    // If !socket->isOpen() then we have already called close() on the socket, but there was still a
    // pending connectToHost() for which we hadn't seen a connected() signal, yet. The connected()
    // has now arrived (as indicated by socketState != ClosingState), but we cannot send anything on
    // such a socket anymore.
    if (socketState == QAbstractSocket::ClosingState ||
            (socketState != QAbstractSocket::UnconnectedState && !socket->isOpen())) {
        if (reply)
            resendCurrent = true;
        return false;
    }

    // already trying to connect?
    if (socketState == QAbstractSocket::HostLookupState ||
        socketState == QAbstractSocket::ConnectingState) {
        return false;
    }

    // make sure that this socket is in a connected state, if not initiate
    // connection to the host.
    if (socketState != QAbstractSocket::ConnectedState) {
        // connect to the host if not already connected.
        state = QHttpNetworkConnectionChannel::ConnectingState;
        pendingEncrypt = ssl;

        // reset state
        pipeliningSupported = PipeliningSupportUnknown;
        authenticationCredentialsSent = false;
        proxyCredentialsSent = false;
        authenticator.detach();
        QAuthenticatorPrivate *priv = QAuthenticatorPrivate::getPrivate(authenticator);
        priv->hasFailed = false;
        proxyAuthenticator.detach();
        priv = QAuthenticatorPrivate::getPrivate(proxyAuthenticator);
        priv->hasFailed = false;

        // This workaround is needed since we use QAuthenticator for NTLM authentication. The "phase == Done"
        // is the usual criteria for emitting authentication signals. The "phase" is set to "Done" when the
        // last header for Authorization is generated by the QAuthenticator. Basic & Digest logic does not
        // check the "phase" for generating the Authorization header. NTLM authentication is a two stage
        // process & needs the "phase". To make sure the QAuthenticator uses the current username/password
        // the phase is reset to Start.
        priv = QAuthenticatorPrivate::getPrivate(authenticator);
        if (priv && priv->phase == QAuthenticatorPrivate::Done)
            priv->phase = QAuthenticatorPrivate::Start;
        priv = QAuthenticatorPrivate::getPrivate(proxyAuthenticator);
        if (priv && priv->phase == QAuthenticatorPrivate::Done)
            priv->phase = QAuthenticatorPrivate::Start;

        QString connectHost = connection->d_func()->hostName;
        quint16 connectPort = connection->d_func()->port;

        QHttpNetworkReply *potentialReply = connection->d_func()->predictNextRequestsReply();
        if (potentialReply) {
            QMetaObject::invokeMethod(potentialReply, "socketStartedConnecting", Qt::QueuedConnection);
        } else if (!h2RequestsToSend.isEmpty()) {
            QMetaObject::invokeMethod(std::as_const(h2RequestsToSend).first().second, "socketStartedConnecting", Qt::QueuedConnection);
        }

#ifndef QT_NO_NETWORKPROXY
        // HTTPS always use transparent proxy.
        if (connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy && !ssl) {
            connectHost = connection->d_func()->networkProxy.hostName();
            connectPort = connection->d_func()->networkProxy.port();
        }
        if (auto *abSocket = qobject_cast<QAbstractSocket *>(socket);
            abSocket && abSocket->proxy().type() == QNetworkProxy::HttpProxy) {
            // Make user-agent field available to HTTP proxy socket engine (QTBUG-17223)
            QByteArray value;
            // ensureConnection is called before any request has been assigned, but can also be
            // called again if reconnecting
            if (request.url().isEmpty()) {
                if (connection->connectionType()
                            == QHttpNetworkConnection::ConnectionTypeHTTP2Direct
                    || (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2
                        && !h2RequestsToSend.isEmpty())) {
                    value = std::as_const(h2RequestsToSend).first().first.headerField("user-agent");
                } else {
                    value = connection->d_func()->predictNextRequest().headerField("user-agent");
                }
            } else {
                value = request.headerField("user-agent");
            }
            if (!value.isEmpty()) {
                QNetworkProxy proxy(abSocket->proxy());
                auto h = proxy.headers();
                h.replaceOrAppend(QHttpHeaders::WellKnownHeader::UserAgent, value);
                proxy.setHeaders(std::move(h));
                abSocket->setProxy(proxy);
            }
        }
#endif
        if (ssl) {
#ifndef QT_NO_SSL
            QSslSocket *sslSocket = qobject_cast<QSslSocket*>(socket);

            // check whether we can re-use an existing SSL session
            // (meaning another socket in this connection has already
            // performed a full handshake)
            if (auto ctx = connection->sslContext())
                QSslSocketPrivate::checkSettingSslContext(sslSocket, std::move(ctx));

            sslSocket->setPeerVerifyName(connection->d_func()->peerVerifyName);
            sslSocket->connectToHostEncrypted(connectHost, connectPort, QIODevice::ReadWrite, networkLayerPreference);
            if (ignoreAllSslErrors)
                sslSocket->ignoreSslErrors();
            sslSocket->ignoreSslErrors(ignoreSslErrorsList);

            // limit the socket read buffer size. we will read everything into
            // the QHttpNetworkReply anyway, so let's grow only that and not
            // here and there.
            sslSocket->setReadBufferSize(64*1024);
#else
            // Need to dequeue the request so that we can emit the error.
            if (!reply)
                connection->d_func()->dequeueRequest(socket);
            connection->d_func()->emitReplyError(socket, reply, QNetworkReply::ProtocolUnknownError);
#endif
        } else {
            // In case of no proxy we can use the Unbuffered QTcpSocket
#ifndef QT_NO_NETWORKPROXY
            if (connection->d_func()->networkProxy.type() == QNetworkProxy::NoProxy
                    && connection->cacheProxy().type() == QNetworkProxy::NoProxy
                    && connection->transparentProxy().type() == QNetworkProxy::NoProxy) {
#endif
                if (auto *s = qobject_cast<QAbstractSocket *>(socket)) {
                    s->connectToHost(connectHost, connectPort,
                                     QIODevice::ReadWrite | QIODevice::Unbuffered,
                                     networkLayerPreference);
                    // For an Unbuffered QTcpSocket, the read buffer size has a special meaning.
                    s->setReadBufferSize(1 * 1024);
#if QT_CONFIG(localserver)
                } else if (auto *s = qobject_cast<QLocalSocket *>(socket)) {
                    s->connectToServer(connectHost);
#endif
                }
#ifndef QT_NO_NETWORKPROXY
            } else {
                auto *s = qobject_cast<QAbstractSocket *>(socket);
                Q_ASSERT(s);
                // limit the socket read buffer size. we will read everything into
                // the QHttpNetworkReply anyway, so let's grow only that and not
                // here and there.
                s->connectToHost(connectHost, connectPort, QIODevice::ReadWrite, networkLayerPreference);
                s->setReadBufferSize(64 * 1024);
            }
#endif
        }
        return false;
    }

    // This code path for ConnectedState
    if (pendingEncrypt) {
        // Let's only be really connected when we have received the encrypted() signal. Else the state machine seems to mess up
        // and corrupt the things sent to the server.
        return false;
    }

    return true;
}